

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O3

void __thiscall
cmCoreTryCompile::FindOutputFile(cmCoreTryCompile *this,string *targetName,TargetType targetType)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  pointer pbVar4;
  bool bVar5;
  string *psVar6;
  char *pcVar7;
  ostream *poVar8;
  pointer pbVar9;
  string tmpOutputFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchDirs;
  ostringstream emsg;
  string local_248;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  (this->FindErrorMessage)._M_string_length = 0;
  *(this->FindErrorMessage)._M_dataplus._M_p = '\0';
  (this->OutputFile)._M_string_length = 0;
  *(this->OutputFile)._M_dataplus._M_p = '\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"/","");
  if (targetType == EXECUTABLE) {
    std::__cxx11::string::_M_append((char *)&local_248,(ulong)(targetName->_M_dataplus)._M_p);
    pcVar2 = (this->super_cmCommand).Makefile;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_EXECUTABLE_SUFFIX","");
    psVar6 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_1a8);
    std::__cxx11::string::_M_append((char *)&local_248,(ulong)(psVar6->_M_dataplus)._M_p);
    if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) goto LAB_0036fc4a;
  }
  else {
    pcVar2 = (this->super_cmCommand).Makefile;
    pcVar1 = local_1a8 + 0x10;
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_STATIC_LIBRARY_PREFIX","");
    psVar6 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_1a8);
    std::__cxx11::string::_M_append((char *)&local_248,(ulong)(psVar6->_M_dataplus)._M_p);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_248,(ulong)(targetName->_M_dataplus)._M_p);
    pcVar2 = (this->super_cmCommand).Makefile;
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_STATIC_LIBRARY_SUFFIX","");
    psVar6 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_1a8);
    std::__cxx11::string::_M_append((char *)&local_248,(ulong)(psVar6->_M_dataplus)._M_p);
    if ((pointer)local_1a8._0_8_ == pcVar1) goto LAB_0036fc4a;
  }
  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
LAB_0036fc4a:
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(&local_208);
  pcVar2 = (this->super_cmCommand).Makefile;
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CMAKE_TRY_COMPILE_CONFIGURATION","");
  pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"/","");
    std::__cxx11::string::append(local_1a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[7]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
             (char (*) [7])"/Debug");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
             (char (*) [13])"/Development");
  pbVar4 = local_208.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_208.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_208.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar9 = local_208.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar3 = (this->BinaryDirectory)._M_dataplus._M_p;
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar3,pcVar3 + (this->BinaryDirectory)._M_string_length);
      std::__cxx11::string::_M_append((char *)local_1a8,(ulong)(pbVar9->_M_dataplus)._M_p);
      std::__cxx11::string::_M_append((char *)local_1a8,(ulong)local_248._M_dataplus._M_p);
      bVar5 = cmsys::SystemTools::FileExists((string *)local_1a8);
      if (bVar5) {
        cmsys::SystemTools::CollapseFullPath(&local_228,(string *)local_1a8);
        std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        goto LAB_0036fff9;
      }
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar4);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Unable to find the executable at any of:\n",0x29);
  std::operator+(&local_1c8,"  ",&this->BinaryDirectory);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"\n","");
  cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_228,&local_1c8,&local_208,&local_248,&local_1e8);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->FindErrorMessage,(string *)&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_0036fff9:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCoreTryCompile::FindOutputFile(const std::string& targetName,
                                      cmStateEnums::TargetType targetType)
{
  this->FindErrorMessage.clear();
  this->OutputFile.clear();
  std::string tmpOutputFile = "/";
  if (targetType == cmStateEnums::EXECUTABLE) {
    tmpOutputFile += targetName;
    tmpOutputFile +=
      this->Makefile->GetSafeDefinition("CMAKE_EXECUTABLE_SUFFIX");
  } else // if (targetType == cmStateEnums::STATIC_LIBRARY)
  {
    tmpOutputFile +=
      this->Makefile->GetSafeDefinition("CMAKE_STATIC_LIBRARY_PREFIX");
    tmpOutputFile += targetName;
    tmpOutputFile +=
      this->Makefile->GetSafeDefinition("CMAKE_STATIC_LIBRARY_SUFFIX");
  }

  // a list of directories where to search for the compilation result
  // at first directly in the binary dir
  std::vector<std::string> searchDirs;
  searchDirs.emplace_back();

  const char* config =
    this->Makefile->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION");
  // if a config was specified try that first
  if (config && config[0]) {
    std::string tmp = "/";
    tmp += config;
    searchDirs.push_back(std::move(tmp));
  }
  searchDirs.emplace_back("/Debug");
#if defined(__APPLE__)
  std::string app = "/Debug/" + targetName + ".app";
  searchDirs.push_back(std::move(app));
#endif
  searchDirs.emplace_back("/Development");

  for (std::string const& sdir : searchDirs) {
    std::string command = this->BinaryDirectory;
    command += sdir;
    command += tmpOutputFile;
    if (cmSystemTools::FileExists(command)) {
      this->OutputFile = cmSystemTools::CollapseFullPath(command);
      return;
    }
  }

  std::ostringstream emsg;
  emsg << "Unable to find the executable at any of:\n";
  emsg << cmWrap("  " + this->BinaryDirectory, searchDirs, tmpOutputFile, "\n")
       << "\n";
  this->FindErrorMessage = emsg.str();
}